

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

EdgeOperation * __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
          (EdgeOperation *__return_storage_ptr__,
          DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v0,size_t v1)

{
  Partition *this_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  pointer pmVar4;
  ProblemGraph *pPVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  Index IVar9;
  _Base_ptr p_Var10;
  size_t sVar11;
  size_t sVar12;
  runtime_error *this_01;
  Index IVar13;
  Index IVar14;
  long lVar15;
  value_type_conflict4 vVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  pair<bool,_unsigned_long> pVar23;
  pair<bool,_unsigned_long> pVar24;
  double local_78;
  
  bVar6 = edgeExists(this,v0,v1);
  if (!bVar6) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Cannot propose move for an edge that does not exist!");
LAB_00125739:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  vVar16 = getEdgeWeight(this,v0,v1);
  local_78 = -vVar16;
  lVar3 = *(long *)&(this->data_->problemGraph->problem_->nodes).
                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                    super__Vector_impl_data;
  lVar15 = v0 * 0x18;
  uVar1 = *(uint *)(lVar3 + v1 * 0x18);
  uVar2 = *(uint *)(lVar3 + lVar15);
  if (uVar2 == uVar1) {
    pVar23 = hasParent(this,v0);
    IVar13 = pVar23.second;
    pVar24 = hasParent(this,v1);
    IVar14 = pVar24.second;
    bVar6 = pVar24.first;
    bVar7 = pVar23.first;
    if (((bVar6 ^ bVar7) & 1U) == 0) {
      if ((((bVar7 | bVar6) & 1U) != 0) && ((IVar13 == IVar14 & bVar7 & bVar6) != 1))
      goto LAB_00125564;
    }
    else if (*(int *)(*(long *)&(this->data_->problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data + lVar15) != 0) {
      sVar11 = v0;
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        sVar11 = v1;
      }
      sVar11 = sizeOf(this,sVar11);
      auVar17._8_4_ = (int)(sVar11 >> 0x20);
      auVar17._0_8_ = sVar11;
      auVar17._12_4_ = 0x45300000;
      local_78 = local_78 -
                 ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) *
                 this->data_->costBirth;
    }
    pmVar4 = (this->vertices_).
             super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &this->partition_;
    for (p_Var10 = *(_Base_ptr *)((long)&pmVar4[v1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var10 != &pmVar4[v1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      pVar23 = hasParent(this,*(size_t *)(p_Var10 + 1));
      bVar6 = edgeExists(this,v0,*(size_t *)(p_Var10 + 1));
      if ((bVar6) &&
         ((((IVar9 = andres::Partition<unsigned_long>::find(this_00,*(Index *)(p_Var10 + 1)),
            IVar13 == IVar9 &&
            (IVar9 = andres::Partition<unsigned_long>::find(this_00,*(Index *)(p_Var10 + 1)),
            sVar11 = v1, IVar14 != IVar9)) ||
           ((IVar9 = andres::Partition<unsigned_long>::find(this_00,*(Index *)(p_Var10 + 1)),
            IVar14 == IVar9 &&
            (IVar9 = andres::Partition<unsigned_long>::find(this_00,*(Index *)(p_Var10 + 1)),
            sVar11 = v0, IVar13 != IVar9)))) ||
          ((((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0 &&
           ((IVar9 = andres::Partition<unsigned_long>::find(this_00,v0), sVar11 = v1,
            pVar23.second == IVar9 ||
            (IVar9 = andres::Partition<unsigned_long>::find(this_00,v1), sVar11 = v0,
            pVar23.second == IVar9)))))))) {
        vVar16 = getEdgeWeight(this,sVar11,*(size_t *)(p_Var10 + 1));
        local_78 = local_78 - vVar16;
      }
    }
    bVar6 = hasChild(this,v0);
    bVar7 = hasChild(this,v1);
    if (bVar6 == bVar7) {
      if (this->data_->enforceBifurcationConstraint != true) goto LAB_001256fb;
      sVar11 = children(this,v0);
      sVar12 = children(this,v1);
      if (sVar12 + sVar11 < 3) goto LAB_001256fb;
LAB_00125564:
      local_78 = INFINITY;
      goto LAB_001256fb;
    }
    pPVar5 = this->data_->problemGraph;
    if (pPVar5->numberOfFrames_ - 1 ==
        (long)*(int *)(*(long *)&(pPVar5->problem_->nodes).
                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                 _M_impl.super__Vector_impl_data + lVar15)) goto LAB_001256fb;
    bVar6 = hasChild(this,v0);
    sVar11 = v0;
    if (bVar6) {
      sVar11 = v1;
    }
    sVar11 = sizeOf(this,sVar11);
    auVar18._8_4_ = (int)(sVar11 >> 0x20);
    auVar18._0_8_ = sVar11;
    auVar18._12_4_ = 0x45300000;
    dVar22 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) *
             this->data_->costTermination;
  }
  else {
    sVar12 = v1;
    sVar11 = v0;
    if (uVar2 < uVar1) {
      sVar12 = v0;
      sVar11 = v1;
    }
    if ((this->data_->enforceBifurcationConstraint == true) &&
       (sVar8 = children(this,sVar12), 1 < sVar8)) goto LAB_00125564;
    pVar23 = hasParent(this,sVar11);
    sVar8 = pVar23.second;
    if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (*(int *)(*(long *)&(this->data_->problemGraph->problem_->nodes).
                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                             _M_impl.super__Vector_impl_data + sVar11 * 0x18) != 0) {
        dVar22 = this->data_->costBirth;
        sVar11 = sizeOf(this,sVar11);
        auVar19._8_4_ = (int)(sVar11 >> 0x20);
        auVar19._0_8_ = sVar11;
        auVar19._12_4_ = 0x45300000;
        local_78 = local_78 -
                   ((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) * dVar22;
      }
    }
    else {
      if (sVar8 == sVar12) {
        local_78 = INFINITY;
        v0 = sVar11;
        v1 = sVar12;
        goto LAB_001256fb;
      }
      bVar6 = edgeExists(this,sVar11,sVar8);
      if (!bVar6) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Cannot have a parent with no connection!");
        goto LAB_00125739;
      }
      local_78 = getEdgeWeight(this,sVar11,sVar8);
      local_78 = local_78 - vVar16;
      sVar11 = children(this,sVar8);
      if (sVar11 == 1) {
        sVar11 = sizeOf(this,sVar8);
        auVar20._8_4_ = (int)(sVar11 >> 0x20);
        auVar20._0_8_ = sVar11;
        auVar20._12_4_ = 0x45300000;
        local_78 = local_78 +
                   ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) *
                   this->data_->costTermination;
      }
    }
    bVar6 = hasChild(this,sVar12);
    if ((bVar6) ||
       (pPVar5 = this->data_->problemGraph,
       pPVar5->numberOfFrames_ - 1 ==
       (long)*(int *)(*(long *)&(pPVar5->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data + sVar12 * 0x18)))
    goto LAB_001256fb;
    dVar22 = this->data_->costTermination;
    sVar11 = sizeOf(this,sVar12);
    auVar21._8_4_ = (int)(sVar11 >> 0x20);
    auVar21._0_8_ = sVar11;
    auVar21._12_4_ = 0x45300000;
    dVar22 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) * dVar22;
  }
  local_78 = local_78 - dVar22;
LAB_001256fb:
  __return_storage_ptr__->v0 = v0;
  __return_storage_ptr__->v1 = v1;
  __return_storage_ptr__->delta = local_78;
  __return_storage_ptr__->edition = 0;
  return __return_storage_ptr__;
}

Assistant:

inline EdgeOperation proposeMove(const size_t v0, const size_t v1)
    {
        // increaseEdition(v0, v1); // invalidate old moves along (v0, v1)

        if (!edgeExists(v0, v1)) {
            throw std::runtime_error(
                "Cannot propose move for an edge that does not exist!");
        }

        // first part of cost change through merge / setParent.
        auto delta = -getEdgeWeight(v0, v1);

        // potential merge.
        if (getFrameOfNode(v0) == getFrameOfNode(v1)) {

            const auto& p0 = hasParent(v0);
            const auto& p1 = hasParent(v1);

            // Cases that can be merged:
            if (p0.first xor p1.first) { // one with parents.
                if (getFrameOfNode(v0) != 0) {
                    const size_t partitionSize =
                        p0.first ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costBirth * partitionSize;
                }
            } else if (!p0.first && !p1.first) { // no parents.
                ;
            } else if (p0.first && p1.first &&
                       p0.second == p1.second) { // same parents.
                ;
            } else { // the rest cant.
                return {
                    v0, v1,
                    std::numeric_limits<typename EVA::value_type>::infinity(), 0
                };
            }

            // cost adjustments for all nodes that have either first
            // or second as a parent and share connections to the other.
            for (const auto& other : getAdjacentVertices(v1)) {
                const auto& v2 = other.first;
                const auto& p2 = hasParent(v2);

                if (edgeExists(v0, v2)) {
                    // is v2 a parent to v0 and not v1?
                    // (or vice versa)
                    if (p0.second == findRep(v2) and p1.second != findRep(v2)) {
                        delta -= getEdgeWeight(v1, v2);
                    } else if (p1.second == findRep(v2) and
                               p0.second != findRep(v2)) {
                        delta -= getEdgeWeight(v0, v2);
                    } else {

                        // is either v0 or v1 a parent of v2?
                        if (p2.first) {
                            if (p2.second ==
                                findRep(v0)) { // v0 is parent to v2
                                delta -= getEdgeWeight(v1, v2);
                            } else if (p2.second ==
                                       findRep(v1)) { // v1 is parent to v2
                                delta -= getEdgeWeight(v0, v2);
                            }
                        }
                    }
                }
            }

            // if one has no child, we gain a termination cost.
            if (!hasChild(v0) xor !hasChild(v1)) {
                if (getFrameOfNode(v0) !=
                    data_.problemGraph.numberOfFrames() - 1) {

                    const size_t partitionSize =
                        hasChild(v0) ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costTermination * partitionSize;
                }
            } else if (this->data_.enforceBifurcationConstraint &&
                       children(v0) + children(v1) >= 3) {
                delta =
                    std::numeric_limits<typename EVA::value_type>::infinity();
            }

            return { v0, v1, delta, 0 };

            // Potential new parent.
        } else {
            size_t child = v0;
            size_t parent = v1;

            if (getFrameOfNode(child) < getFrameOfNode(parent)) {
                std::swap(child, parent);
            }

            // If bifurcation constraint is active:
            //    dont allow more than two children!
            if (this->data_.enforceBifurcationConstraint) {
                if (children(parent) >= 2) {
                    return { v0, v1, std::numeric_limits<
                                         typename EVA::value_type>::infinity(),
                             0 };
                }
            }

            // is it a re-set?
            {
                auto parentOfChild = hasParent(child);
                if (parentOfChild.first) {

                    if (parentOfChild.second == parent) {
                        return { child, parent,
                                 std::numeric_limits<
                                     typename EVA::value_type>::infinity(),
                                 0 };
                    } else {
                        if (!edgeExists(child, parentOfChild.second)) {
                            throw std::runtime_error(
                                "Cannot have a parent with no connection!");
                        }

                        delta += getEdgeWeight(child, parentOfChild.second);

                        // would the current parent form a terminal?
                        if (children(parentOfChild.second) == 1) {
                            delta += sizeOf(parentOfChild.second) *
                                     data_.costTermination;
                        }
                    }
                    // could we save birth costs?
                } else if (getFrameOfNode(child) != 0) {
                    delta -= data_.costBirth * sizeOf(child);
                }
            }

            if (!hasChild(parent) and
                getFrameOfNode(parent) !=
                    data_.problemGraph.numberOfFrames() - 1) {
                delta -= data_.costTermination * sizeOf(parent);
            }

            return { v0, v1, delta, 0 };
        }
    }